

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

int EVP_PKEY_derive_set_peer(EVP_PKEY_CTX *ctx,EVP_PKEY *peer)

{
  int iVar1;
  int ret;
  EVP_PKEY *peer_local;
  EVP_PKEY_CTX *ctx_local;
  
  if ((((ctx == (EVP_PKEY_CTX *)0x0) || (*(long *)ctx == 0)) ||
      ((*(long *)(*(long *)ctx + 0x60) == 0 &&
       ((*(long *)(*(long *)ctx + 0x50) == 0 && (*(long *)(*(long *)ctx + 0x58) == 0)))))) ||
     (*(long *)(*(long *)ctx + 0x70) == 0)) {
    ERR_put_error(6,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x128);
    ctx_local._4_4_ = 0;
  }
  else if (((*(int *)(ctx + 0x20) == 0x100) || (*(int *)(ctx + 0x20) == 0x40)) ||
          (*(int *)(ctx + 0x20) == 0x80)) {
    iVar1 = (**(code **)(*(long *)ctx + 0x70))(ctx,3,0,peer);
    if (iVar1 < 1) {
      ctx_local._4_4_ = 0;
    }
    else if (iVar1 == 2) {
      ctx_local._4_4_ = 1;
    }
    else if (*(long *)(ctx + 0x10) == 0) {
      ERR_put_error(6,0,0x78,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                    ,0x13d);
      ctx_local._4_4_ = 0;
    }
    else if (*(int *)(*(long *)(ctx + 0x10) + 4) == peer->save_type) {
      iVar1 = EVP_PKEY_missing_parameters(peer);
      if ((iVar1 == 0) &&
         (iVar1 = EVP_PKEY_cmp_parameters(*(EVP_PKEY **)(ctx + 0x10),peer), iVar1 == 0)) {
        ERR_put_error(6,0,0x68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                      ,0x14d);
        return 0;
      }
      EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x18));
      *(EVP_PKEY **)(ctx + 0x18) = peer;
      iVar1 = (**(code **)(*(long *)ctx + 0x70))(ctx,3,1,peer);
      if (iVar1 < 1) {
        *(undefined8 *)(ctx + 0x18) = 0;
        ctx_local._4_4_ = 0;
      }
      else {
        EVP_PKEY_up_ref((EVP_PKEY *)peer);
        ctx_local._4_4_ = 1;
      }
    }
    else {
      ERR_put_error(6,0,0x67,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                    ,0x142);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(6,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x12e);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_PKEY_derive_set_peer(EVP_PKEY_CTX *ctx, EVP_PKEY *peer) {
  int ret;
  if (!ctx || !ctx->pmeth ||
      !(ctx->pmeth->derive || ctx->pmeth->encrypt || ctx->pmeth->decrypt) ||
      !ctx->pmeth->ctrl) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }
  if (ctx->operation != EVP_PKEY_OP_DERIVE &&
      ctx->operation != EVP_PKEY_OP_ENCRYPT &&
      ctx->operation != EVP_PKEY_OP_DECRYPT) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATON_NOT_INITIALIZED);
    return 0;
  }

  ret = ctx->pmeth->ctrl(ctx, EVP_PKEY_CTRL_PEER_KEY, 0, peer);

  if (ret <= 0) {
    return 0;
  }

  if (ret == 2) {
    return 1;
  }

  if (!ctx->pkey) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }

  if (ctx->pkey->type != peer->type) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_KEY_TYPES);
    return 0;
  }

  // ran@cryptocom.ru: For clarity.  The error is if parameters in peer are
  // present (!missing) but don't match.  EVP_PKEY_cmp_parameters may return
  // 1 (match), 0 (don't match) and -2 (comparison is not defined).  -1
  // (different key types) is impossible here because it is checked earlier.
  // -2 is OK for us here, as well as 1, so we can check for 0 only.
  if (!EVP_PKEY_missing_parameters(peer) &&
      !EVP_PKEY_cmp_parameters(ctx->pkey, peer)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_PARAMETERS);
    return 0;
  }

  EVP_PKEY_free(ctx->peerkey);
  ctx->peerkey = peer;

  ret = ctx->pmeth->ctrl(ctx, EVP_PKEY_CTRL_PEER_KEY, 1, peer);

  if (ret <= 0) {
    ctx->peerkey = NULL;
    return 0;
  }

  EVP_PKEY_up_ref(peer);
  return 1;
}